

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::foldDereference
          (TIntermediate *this,TIntermTyped *node,int index,TSourceLoc *loc)

{
  TIntermConstantUnion *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  TQualifier *pTVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  const_reference pvVar6;
  undefined4 extraout_var_02;
  TConstUnionArray *a;
  undefined4 extraout_var_03;
  TConstUnionArray local_e8;
  int local_d4;
  int local_d0;
  int i;
  int start;
  int size;
  TIntermTyped *result;
  TType dereferencedType;
  TSourceLoc *loc_local;
  int index_local;
  TIntermTyped *node_local;
  TIntermediate *this_local;
  
  dereferencedType.spirvType = (TSpirvType *)loc;
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  TType::TType((TType *)&result,(TType *)CONCAT44(extraout_var,iVar3),index,false);
  pTVar5 = TType::getQualifier((TType *)&result);
  *(ulong *)&pTVar5->field_0x8 = *(ulong *)&pTVar5->field_0x8 & 0xffffffffffffff80 | 2;
  _start = (TIntermConstantUnion *)0x0;
  i = TType::computeNumComponents((TType *)&result);
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_00,iVar3));
  if (bVar2) {
    local_d0 = 0;
  }
  else {
    uVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2a])();
    if (((uVar4 & 1) == 0) &&
       (uVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2d])(), (uVar4 & 1) != 0)) {
      uVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2d])();
      if ((uVar4 & 1) == 0) {
        __assert_fail("node->isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                      ,0x4dd,
                      "TIntermTyped *glslang::TIntermediate::foldDereference(TIntermTyped *, int, const TSourceLoc &)"
                     );
      }
      local_d0 = 0;
      for (local_d4 = 0; local_d4 < index; local_d4 = local_d4 + 1) {
        iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        this_00 = &TType::getStruct((TType *)CONCAT44(extraout_var_01,iVar3))->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        pvVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](this_00,(long)local_d4);
        iVar3 = TType::computeNumComponents(pvVar6->type);
        local_d0 = iVar3 + local_d0;
      }
    }
    else {
      local_d0 = i * index;
    }
  }
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])();
  a = TIntermConstantUnion::getConstArray((TIntermConstantUnion *)CONCAT44(extraout_var_02,iVar3));
  TConstUnionArray::TConstUnionArray(&local_e8,a,local_d0,i);
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  _start = addConstantUnion(this,&local_e8,(TType *)CONCAT44(extraout_var_03,iVar3),
                            (TSourceLoc *)dereferencedType.spirvType,false);
  TConstUnionArray::~TConstUnionArray(&local_e8);
  pTVar1 = (TIntermConstantUnion *)node;
  if (_start != (TIntermConstantUnion *)0x0) {
    (*(_start->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(_start,&result);
    pTVar1 = _start;
  }
  _start = pTVar1;
  pTVar1 = _start;
  TType::~TType((TType *)&result);
  return &pTVar1->super_TIntermTyped;
}

Assistant:

TIntermTyped* TIntermediate::foldDereference(TIntermTyped* node, int index, const TSourceLoc& loc)
{
    TType dereferencedType(node->getType(), index);
    dereferencedType.getQualifier().storage = EvqConst;
    TIntermTyped* result = nullptr;
    int size = dereferencedType.computeNumComponents();

    // arrays, vectors, matrices, all use simple multiplicative math
    // while structures need to add up heterogeneous members
    int start;
    if (node->getType().isCoopMat())
        start = 0;
    else if (node->isArray() || ! node->isStruct())
        start = size * index;
    else {
        // it is a structure
        assert(node->isStruct());
        start = 0;
        for (int i = 0; i < index; ++i)
            start += (*node->getType().getStruct())[i].type->computeNumComponents();
    }

    result = addConstantUnion(TConstUnionArray(node->getAsConstantUnion()->getConstArray(), start, size), node->getType(), loc);

    if (result == nullptr)
        result = node;
    else
        result->setType(dereferencedType);

    return result;
}